

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O2

void ihevc_inter_pred_chroma_horz
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  int iVar1;
  int iVar2;
  long lVar3;
  short sVar4;
  int iVar5;
  UWORD8 *pUVar6;
  short sVar7;
  UWORD8 *pUVar8;
  ulong uVar9;
  
  if (ht < 1) {
    ht = 0;
  }
  pUVar6 = pu1_src + -1;
  for (iVar1 = 0; iVar1 != ht; iVar1 = iVar1 + 1) {
    pUVar8 = pUVar6;
    for (uVar9 = 0; (long)uVar9 < (long)(wd * 2); uVar9 = uVar9 + 2) {
      sVar4 = 0;
      sVar7 = 0;
      for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
        sVar4 = sVar4 + (ushort)pUVar8[lVar3 * 2 + -1] * (short)pi1_coeff[lVar3];
        sVar7 = sVar7 + (ushort)pUVar8[lVar3 * 2] * (short)pi1_coeff[lVar3];
      }
      iVar2 = sVar4 * 0x400 + 0x8000 >> 0x10;
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      if (0xfe < iVar2) {
        iVar2 = 0xff;
      }
      iVar5 = sVar7 * 0x400 + 0x8000 >> 0x10;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      if (0xfe < iVar5) {
        iVar5 = 0xff;
      }
      pu1_dst[uVar9] = (UWORD8)iVar2;
      pu1_dst[uVar9 | 1] = (UWORD8)iVar5;
      pUVar8 = pUVar8 + 2;
    }
    pu1_dst = pu1_dst + dst_strd;
    pUVar6 = pUVar6 + src_strd;
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_horz(UWORD8 *pu1_src,
                                  UWORD8 *pu1_dst,
                                  WORD32 src_strd,
                                  WORD32 dst_strd,
                                  WORD8 *pi1_coeff,
                                  WORD32 ht,
                                  WORD32 wd)
{
    WORD32 row, col, i;
    WORD16 i2_tmp_u, i2_tmp_v;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col += 2)
        {
            i2_tmp_u = 0;
            i2_tmp_v = 0;
            for(i = 0; i < NTAPS_CHROMA; i++)
            {
                i2_tmp_u += pi1_coeff[i] * pu1_src[col + (i - 1) * 2];
                i2_tmp_v += pi1_coeff[i] * pu1_src[col + 1 + (i - 1) * 2];
            }

            i2_tmp_u = (i2_tmp_u + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH;
            i2_tmp_u = CLIP_U8(i2_tmp_u);
            i2_tmp_v = (i2_tmp_v + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH;
            i2_tmp_v = CLIP_U8(i2_tmp_v);


            pu1_dst[col] = (UWORD8)i2_tmp_u;
            pu1_dst[col + 1] = (UWORD8)i2_tmp_v;
        }

        pu1_src += src_strd;
        pu1_dst += dst_strd;
    }
}